

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void WriteCompactSize<HashWriter>(HashWriter *os,uint64_t nSize)

{
  size_t len;
  long in_FS_OFFSET;
  uint64_t local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (nSize < 0xfd) {
    local_28 = CONCAT71(local_28._1_7_,(char)nSize);
    len = 1;
  }
  else if (nSize < 0x10000) {
    local_28 = CONCAT71(local_28._1_7_,0xfd);
    CSHA256::Write(&os->ctx,(uchar *)&local_28,1);
    local_28 = CONCAT62(local_28._2_6_,(short)nSize);
    len = 2;
  }
  else if (nSize >> 0x20 == 0) {
    local_28 = CONCAT71(local_28._1_7_,0xfe);
    CSHA256::Write(&os->ctx,(uchar *)&local_28,1);
    local_28 = CONCAT44(local_28._4_4_,(int)nSize);
    len = 4;
  }
  else {
    local_28 = CONCAT71(local_28._1_7_,0xff);
    CSHA256::Write(&os->ctx,(uchar *)&local_28,1);
    len = 8;
    local_28 = nSize;
  }
  CSHA256::Write(&os->ctx,(uchar *)&local_28,len);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteCompactSize(Stream& os, uint64_t nSize)
{
    if (nSize < 253)
    {
        ser_writedata8(os, nSize);
    }
    else if (nSize <= std::numeric_limits<uint16_t>::max())
    {
        ser_writedata8(os, 253);
        ser_writedata16(os, nSize);
    }
    else if (nSize <= std::numeric_limits<unsigned int>::max())
    {
        ser_writedata8(os, 254);
        ser_writedata32(os, nSize);
    }
    else
    {
        ser_writedata8(os, 255);
        ser_writedata64(os, nSize);
    }
    return;
}